

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_binder.cpp
# Opt level: O3

string * __thiscall
duckdb::ExtractCollation_abi_cxx11_
          (string *__return_storage_ptr__,duckdb *this,
          vector<duckdb::unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>,_true>
          *children)

{
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *puVar1;
  size_t __n;
  bool bVar2;
  int iVar3;
  pointer pEVar4;
  BinderException *this_00;
  LogicalType *type;
  unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> *this_01;
  string child_collation;
  string local_70;
  string local_50;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  this_01 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)this;
  puVar1 = *(unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> **)
            (this + 8);
  if (this_01 != puVar1) {
    do {
      pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
               operator->(this_01);
      if (((pEVar4->return_type).id_ == VARCHAR) &&
         (bVar2 = LogicalType::HasAlias(&pEVar4->return_type), !bVar2)) {
        pEVar4 = unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true>::
                 operator->(this_01);
        StringType::GetCollation_abi_cxx11_(&local_70,(StringType *)&pEVar4->return_type,type);
        __n = __return_storage_ptr__->_M_string_length;
        if (__n == 0) {
          ::std::__cxx11::string::_M_assign((string *)__return_storage_ptr__);
        }
        else if ((local_70._M_string_length != 0) &&
                ((__n != local_70._M_string_length ||
                 (iVar3 = bcmp((__return_storage_ptr__->_M_dataplus)._M_p,local_70._M_dataplus._M_p,
                               __n), iVar3 != 0)))) {
          this_00 = (BinderException *)__cxa_allocate_exception(0x10);
          local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_50,"Cannot combine types with different collation!","");
          BinderException::BinderException(this_00,&local_50);
          __cxa_throw(this_00,&BinderException::typeinfo,::std::runtime_error::~runtime_error);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p);
        }
      }
      this_01 = this_01 + 1;
    } while (this_01 != puVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

string ExtractCollation(const vector<unique_ptr<Expression>> &children) {
	string collation;
	for (auto &arg : children) {
		if (!RequiresCollationPropagation(arg->return_type)) {
			// not a varchar column
			continue;
		}
		auto child_collation = StringType::GetCollation(arg->return_type);
		if (collation.empty()) {
			collation = child_collation;
		} else if (!child_collation.empty() && collation != child_collation) {
			throw BinderException("Cannot combine types with different collation!");
		}
	}
	return collation;
}